

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeventqueue.h
# Opt level: O3

xcb_generic_event_t * __thiscall
QXcbEventQueue::peek<QXcbConnection::compressEvent(xcb_generic_event_t*)const::__2>
          (QXcbEventQueue *this,PeekOption option,anon_class_16_2_e8808096 *peeker)

{
  xcb_generic_event_t *event;
  bool bVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  
  flushBufferedEvents(this);
  plVar3 = *(long **)(this + 0x10);
  if ((plVar3 != *(long **)(this + 0x18)) || (*plVar3 != 0)) {
    while( true ) {
      event = (xcb_generic_event_t *)*plVar3;
      if ((event != (xcb_generic_event_t *)0x0) &&
         ((bVar1 = QXcbBasicConnection::isXIType
                             (*(QXcbBasicConnection **)CONCAT44(in_register_00000034,option),event,
                              0x13), bVar1 &&
          (uVar2 = event->pad[3] / 0x7fffffff,
          *(int *)((undefined8 *)CONCAT44(in_register_00000034,option))[1] ==
          (uVar2 << 0x1f | uVar2) + event->pad[3])))) {
        return event;
      }
      if (plVar3 == *(long **)(this + 0x18)) break;
      plVar3 = (long *)plVar3[1];
    }
  }
  return (xcb_generic_event_t *)0x0;
}

Assistant:

xcb_generic_event_t *QXcbEventQueue::peek(PeekOption option, Peeker &&peeker)
{
    flushBufferedEvents();
    if (isEmpty())
        return nullptr;

    QXcbEventNode *node = m_head;
    do {
        xcb_generic_event_t *event = node->event;
        if (event && peeker(event, event->response_type & ~0x80)) {
            if (option == PeekConsumeMatch || option == PeekConsumeMatchAndContinue)
                node->event = nullptr;

            if (option != PeekConsumeMatchAndContinue)
                return event;
        }
        if (node == m_flushedTail)
            break;
        node = node->next;
    } while (true);

    return nullptr;
}